

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O3

bool sfc::bpp_allowed_for_mode(uint bpp,Mode mode)

{
  undefined1 uVar1;
  
  uVar1 = (*(code *)(&DAT_0015f870 + *(int *)(&DAT_0015f870 + (ulong)mode * 4)))();
  return (bool)uVar1;
}

Assistant:

constexpr bool bpp_allowed_for_mode(unsigned bpp, Mode mode) {
  switch (mode) {
  case Mode::snes:
    return bpp == 2 || bpp == 4 || bpp == 8;
  case Mode::snes_mode7:
    return bpp == 8;
  case Mode::gb:
  case Mode::gbc:
  case Mode::ngp:
  case Mode::ws:
    return bpp == 1 || bpp == 2;
  case Mode::wsc:
    return bpp == 2 || bpp == 4;
  case Mode::gba:
    return bpp == 4 || bpp == 8;
  case Mode::gba_affine:
    return bpp == 8;
  case Mode::md:
  case Mode::pce:
  case Mode::pce_sprite:
  case Mode::wsc_packed:
  case Mode::sms:
  case Mode::gg:
    return bpp == 4;
  case Mode::ngpc:
    return bpp == 2;
  case Mode::none:
    return false;
  }
}